

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::EndDynamicFunctionReferences(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> **ppSVar3;
  undefined4 *puVar4;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this_00;
  JavascriptLibrary *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                      ((WriteBarrierPtr *)&this->dynamicFunctionReference);
  if (*ppSVar3 == (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1cd0,"(this->dynamicFunctionReference != nullptr)",
                                "this->dynamicFunctionReference != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->dynamicFunctionReferenceDepth = this->dynamicFunctionReferenceDepth - 1;
  if (this->dynamicFunctionReferenceDepth == 0) {
    this_00 = Memory::WriteBarrierPtr<SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>_>::
              operator->(&this->dynamicFunctionReference);
    SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Clear(this_00);
  }
  return;
}

Assistant:

void JavascriptLibrary::EndDynamicFunctionReferences()
    {
        Assert(this->dynamicFunctionReference != nullptr);

        this->dynamicFunctionReferenceDepth--;

        if (this->dynamicFunctionReferenceDepth == 0)
        {
            this->dynamicFunctionReference->Clear();
        }
    }